

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

void __thiscall
duckdb::ReservoirSample::Merge
          (ReservoirSample *this,
          unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
          *other)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false> __ptr;
  _Head_base<0UL,_duckdb::ReservoirChunk_*,_false> __p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer pBVar4;
  ReservoirSample *other_00;
  pointer pRVar5;
  pointer pBVar6;
  SelectionVector *sel;
  shared_ptr<duckdb::SelectionData,_true> local_38;
  
  if ((this->super_BlockingSample).destroyed == false) {
    sel = (SelectionVector *)other;
    pBVar4 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
             operator->(other);
    if (pBVar4->destroyed != true) {
      pBVar4 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
               ::operator->(other);
      other_00 = BlockingSample::Cast<duckdb::ReservoirSample>(pBVar4);
      if ((other_00->reservoir_chunk).
          super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
          .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl !=
          (ReservoirChunk *)0x0) {
        pRVar5 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                 ::operator->(&other_00->reservoir_chunk);
        if ((pRVar5->chunk).count != 0) {
          if ((this->reservoir_chunk).
              super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
              .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl !=
              (ReservoirChunk *)0x0) {
            pRVar5 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                     ::operator->(&this->reservoir_chunk);
            if ((pRVar5->chunk).count != 0) {
              this_00 = &(this->super_BlockingSample).base_reservoir_sample;
              pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                       ::operator->(this_00);
              if ((pBVar6->reservoir_weights).c.
                  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (pBVar6->reservoir_weights).c.
                  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         ::operator->(&(other_00->super_BlockingSample).base_reservoir_sample);
                if ((pBVar6->reservoir_weights).c.
                    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    (pBVar6->reservoir_weights).c.
                    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  SimpleMerge(this,other_00);
                  return;
                }
              }
              pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                       ::operator->(this_00);
              BaseReservoirSampling::FillWeights(pBVar6,sel,&this->sel_size);
              pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                       ::operator->(&(other_00->super_BlockingSample).base_reservoir_sample);
              BaseReservoirSampling::FillWeights(pBVar6,sel,&other_00->sel_size);
              WeightedMerge(this,other_00);
              return;
            }
          }
          pBVar4 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                   ::operator->(other);
          _Var1._M_head_impl =
               (pBVar4->base_reservoir_sample).
               super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
               .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl;
          (pBVar4->base_reservoir_sample).
          super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
          .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl =
               (BaseReservoirSampling *)0x0;
          __ptr._M_head_impl =
               (this->super_BlockingSample).base_reservoir_sample.
               super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
               .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl;
          (this->super_BlockingSample).base_reservoir_sample.
          super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BaseReservoirSampling_*,_std::default_delete<duckdb::BaseReservoirSampling>_>
          .super__Head_base<0UL,_duckdb::BaseReservoirSampling_*,_false>._M_head_impl =
               _Var1._M_head_impl;
          if (__ptr._M_head_impl != (BaseReservoirSampling *)0x0) {
            ::std::default_delete<duckdb::BaseReservoirSampling>::operator()
                      ((default_delete<duckdb::BaseReservoirSampling> *)
                       &(this->super_BlockingSample).base_reservoir_sample,__ptr._M_head_impl);
          }
          __p._M_head_impl =
               (other_00->reservoir_chunk).
               super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
               .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl;
          (other_00->reservoir_chunk).
          super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
          .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl =
               (ReservoirChunk *)0x0;
          ::std::
          __uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
          reset((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
                 *)&this->reservoir_chunk,__p._M_head_impl);
          local_38.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          local_38.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          shared_ptr<duckdb::SelectionData,_true>::operator=
                    (&local_38,&(other_00->sel).selection_data);
          _Var3._M_pi = local_38.internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          peVar2 = local_38.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (this->sel).sel_vector = (other_00->sel).sel_vector;
          local_38.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          local_38.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_01 = (this->sel).selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (this->sel).selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
          (this->sel).selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               _Var3._M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            if (local_38.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_38.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          this->sel_size = other_00->sel_size;
        }
      }
      return;
    }
  }
  (*(this->super_BlockingSample)._vptr_BlockingSample[5])(this);
  return;
}

Assistant:

void ReservoirSample::Merge(unique_ptr<BlockingSample> other) {
	if (destroyed || other->destroyed) {
		Destroy();
		return;
	}

	D_ASSERT(other->type == SampleType::RESERVOIR_SAMPLE);
	auto &other_sample = other->Cast<ReservoirSample>();

	// if the other sample has not collected anything yet return
	if (!other_sample.reservoir_chunk || other_sample.reservoir_chunk->chunk.size() == 0) {
		return;
	}

	// this has not collected samples, take over the other
	if (!reservoir_chunk || reservoir_chunk->chunk.size() == 0) {
		base_reservoir_sample = std::move(other->base_reservoir_sample);
		reservoir_chunk = std::move(other_sample.reservoir_chunk);
		sel = SelectionVector(other_sample.sel);
		sel_size = other_sample.sel_size;
		Verify();
		return;
	}
	//! Both samples are still in "fast sampling" method
	if (GetSamplingState() == SamplingState::RANDOM && other_sample.GetSamplingState() == SamplingState::RANDOM) {
		SimpleMerge(other_sample);
		return;
	}

	// One or none of the samples are in "Fast Sampling" method.
	// When this is the case, switch both to slow sampling
	ConvertToReservoirSample();
	other_sample.ConvertToReservoirSample();
	WeightedMerge(other_sample);
}